

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ucnv_io.cpp
# Opt level: O3

char * ucnv_io_stripASCIIForCompare_63(char *dst,char *name)

{
  byte bVar1;
  bool bVar2;
  char *pcVar3;
  uint8_t uVar4;
  uint8_t uVar5;
  char *dstItr;
  ulong uVar6;
  ulong uVar7;
  
  pcVar3 = dst;
  bVar1 = *name;
  if (bVar1 != 0) {
    bVar2 = false;
    do {
      uVar6 = (ulong)bVar1;
      bVar2 = !bVar2;
      while( true ) {
        name = (char *)((byte *)name + 1);
        uVar4 = (uint8_t)uVar6;
        if ((-1 < (char)uVar4) && (uVar5 = ""[uVar6 & 0xff], uVar5 != '\0')) break;
        uVar7 = (ulong)(byte)*name;
LAB_002bbc08:
        bVar2 = true;
        uVar6 = uVar7 & 0xffffffff;
        if ((char)uVar7 == '\0') goto LAB_002bbc3c;
      }
      if (uVar5 != '\x01') {
        if (uVar5 != '\x02') {
          bVar2 = false;
          goto LAB_002bbc2e;
        }
LAB_002bbc1e:
        bVar2 = true;
        uVar5 = uVar4;
        goto LAB_002bbc2e;
      }
      if (!bVar2) goto LAB_002bbc1e;
      uVar7 = (ulong)*name;
      if ((-1 < (long)uVar7) && (""[uVar7] - 1 < 2)) goto LAB_002bbc08;
      bVar2 = false;
      uVar5 = uVar4;
LAB_002bbc2e:
      *dst = uVar5;
      dst = (char *)((uint8_t *)dst + 1);
      bVar1 = *name;
    } while (bVar1 != 0);
  }
LAB_002bbc3c:
  *dst = '\0';
  return pcVar3;
}

Assistant:

U_CAPI char * U_CALLCONV
ucnv_io_stripASCIIForCompare(char *dst, const char *name) {
    char *dstItr = dst;
    uint8_t type, nextType;
    char c1;
    UBool afterDigit = FALSE;

    while ((c1 = *name++) != 0) {
        type = GET_ASCII_TYPE(c1);
        switch (type) {
        case UIGNORE:
            afterDigit = FALSE;
            continue; /* ignore all but letters and digits */
        case ZERO:
            if (!afterDigit) {
                nextType = GET_ASCII_TYPE(*name);
                if (nextType == ZERO || nextType == NONZERO) {
                    continue; /* ignore leading zero before another digit */
                }
            }
            break;
        case NONZERO:
            afterDigit = TRUE;
            break;
        default:
            c1 = (char)type; /* lowercased letter */
            afterDigit = FALSE;
            break;
        }
        *dstItr++ = c1;
    }
    *dstItr = 0;
    return dst;
}